

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_ThreeRowsThreeVarsOptimalSolution_Test::
SimplexTest_ThreeRowsThreeVarsOptimalSolution_Test
          (SimplexTest_ThreeRowsThreeVarsOptimalSolution_Test *this)

{
  undefined8 *in_RDI;
  SimplexTest *unaff_retaddr;
  
  SimplexTest::SimplexTest(unaff_retaddr);
  *in_RDI = &PTR__SimplexTest_ThreeRowsThreeVarsOptimalSolution_Test_0026c9a8;
  return;
}

Assistant:

TEST_F(SimplexTest, ThreeRowsThreeVarsOptimalSolution) {
  lp.add_column(ColType::LowerBound, 0, inf, -1);
  lp.add_column(ColType::LowerBound, 0, inf, -2);
  lp.add_column(ColType::LowerBound, 0, inf, 3);
  lp.add_row(RowType::LE, -inf, 14, {2, 1, 1});
  lp.add_row(RowType::LE, -inf, 28, {4, 2, 3});
  lp.add_row(RowType::LE, -inf, 30, {2, 5, 5});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-13.0, z);
}